

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O2

int Granulator::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  int iVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  EffectData *pEVar6;
  GranulatorSample *pGVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  float __x;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  MutexScopeLock mutexScope;
  
  pEVar6 = UnityAudioEffectState::GetEffectData<Granulator::EffectData>(state);
  iVar4 = strncmp(name,"Waveform",8);
  if (iVar4 == 0) {
    uVar9 = (uint)pEVar6->p[0xc];
    mutexScope.mutex = (Mutex *)0x0;
    if ((int)uVar9 < 0) {
      pGVar7 = &pEVar6->delay;
    }
    else {
      mutexScope.mutex = (Mutex *)sampleMutex;
      Mutex::Lock((Mutex *)sampleMutex);
      if (GetGranulatorSample(int)::initialized == '\0') {
        memset(GetGranulatorSample(int)::samples,0,0x4280);
        GetGranulatorSample(int)::initialized = '\x01';
      }
      pGVar7 = (GranulatorSample *)(GetGranulatorSample(int)::samples + (ulong)uVar9 * 0x428);
    }
    iVar4 = pGVar7->numsamples;
    if ((iVar4 == 0) || (iVar1 = pGVar7->numchannels, iVar1 == 0)) {
      memset(buffer,0,(long)numsamples << 2);
    }
    else {
      iVar3 = iVar1 + -1;
      if (name[8] + -0x30 < iVar1) {
        iVar3 = name[8] + -0x30;
      }
      uVar10 = 0;
      iVar12 = 0;
      if ((int)uVar9 < 0) {
        iVar12 = pEVar6->delaypos;
      }
      pfVar2 = pGVar7->preview;
      fVar14 = (float)(iVar4 + -2) / (float)numsamples;
      if (pGVar7 != &pEVar6->delay) {
        iVar12 = 0;
      }
      uVar11 = (ulong)(uint)numsamples;
      if (numsamples < 1) {
        uVar11 = uVar10;
      }
      fVar16 = 0.0;
      for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
        __x = (float)(int)uVar10 * fVar14;
        fVar13 = floorf(__x);
        iVar5 = 0;
        if (iVar4 <= (int)fVar13 + iVar12) {
          iVar5 = iVar4;
        }
        if (-1 < (int)uVar9) {
          iVar5 = 0;
        }
        iVar5 = ((int)fVar13 + iVar12) - iVar5;
        fVar15 = 0.0;
        fVar17 = 0.0;
        if (iVar5 < iVar4) {
          iVar8 = 0;
          if (iVar4 <= iVar5 + 1) {
            iVar8 = iVar4;
          }
          if (-1 < (int)uVar9) {
            iVar8 = 0;
          }
          fVar17 = pfVar2[(long)iVar3 + (long)(iVar5 * iVar1)];
          iVar5 = (iVar5 - iVar8) + 1;
          if (iVar5 < iVar4) {
            fVar17 = fVar17 + (pfVar2[(long)iVar3 + (long)(iVar5 * iVar1)] - fVar17) *
                              (__x - (float)(int)fVar13);
          }
        }
        if (uVar10 != 0) {
          fVar15 = (fVar17 - fVar16) * (1.0 / fVar14);
        }
        buffer[uVar10] = fVar15;
        fVar16 = fVar17;
      }
    }
    MutexScopeLock::~MutexScopeLock(&mutexScope);
  }
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (strncmp(name, "Waveform", 8) == 0)
        {
            int usesample = (int)data->p[P_USESAMPLE];
            MutexScopeLock mutexScope(Granulator::sampleMutex, usesample >= 0);
            GranulatorSample* gs = (usesample >= 0) ? &GetGranulatorSample(usesample) : &data->delay;
            if (gs->numsamples == 0 || gs->numchannels == 0)
            {
                memset(buffer, 0, sizeof(float) * numsamples);
                return UNITY_AUDIODSP_OK;
            }
            int channel = name[8] - '0';
            if (channel >= gs->numchannels)
                channel = gs->numchannels - 1;
            int delaypos = (usesample >= 0) ? 0 : data->delaypos;
            const float* src = gs->preview + channel;
            float scale = (float)(gs->numsamples - 2) / (float)numsamples;
            float invscale = 1.0f / scale, prev = 0.0f;
            for (int n = 0; n < numsamples; n++)
            {
                float f = n * scale;
                int i = FastFloor(f);
                f -= i;
                if (gs == &data->delay)
                    i += delaypos;
                float s = 0.0f;
                if (usesample < 0 && i >= gs->numsamples)
                    i -= gs->numsamples;
                if (i < gs->numsamples)
                {
                    s = src[gs->numchannels * i++];
                    if (usesample < 0 && i >= gs->numsamples)
                        i -= gs->numsamples;
                    if (i < gs->numsamples)
                        s += (src[gs->numchannels * i] - s) * f;
                }
                buffer[n] = (n == 0) ? 0.0f : (s - prev) * invscale;
                prev = s;
            }
        }
        return UNITY_AUDIODSP_OK;
    }